

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O0

string * __thiscall
soul::SourceCodeUtilities::getFileSummaryTitle_abi_cxx11_
          (string *__return_storage_ptr__,SourceCodeUtilities *this,Comment *summary)

{
  bool bVar1;
  const_reference pvVar2;
  string local_130 [32];
  string_view local_110;
  string_view local_100;
  string local_f0;
  undefined1 local_c9;
  string_view local_c8;
  string local_b8;
  string local_98;
  string_view local_78;
  string local_58;
  undefined1 local_38 [8];
  string firstLine;
  Comment *summary_local;
  string *title;
  
  firstLine.field_2._8_8_ = this;
  if (((byte)*this & 1) != 0) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(this + 8));
    if (!bVar1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(firstLine.field_2._8_8_ + 8),0);
      std::__cxx11::string::string((string *)&local_58,(string *)pvVar2);
      choc::text::trim((string *)local_38,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::string((string *)&local_b8,(string *)local_38);
      toLowerCase(&local_98,&local_b8);
      local_78 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_98);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c8,"title:");
      bVar1 = choc::text::startsWith(local_78,local_c8);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
      if (bVar1) {
        local_c9 = 0;
        std::__cxx11::string::substr((ulong)&local_f0,(ulong)local_38);
        choc::text::trim(__return_storage_ptr__,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        local_100 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)__return_storage_ptr__);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_110,".");
        bVar1 = choc::text::endsWith(local_100,local_110);
        if (bVar1) {
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)local_130,(ulong)__return_storage_ptr__);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_130);
          std::__cxx11::string::~string(local_130);
        }
        bVar1 = true;
        local_c9 = 1;
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)local_38);
      if (bVar1) {
        return __return_storage_ptr__;
      }
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCodeUtilities::getFileSummaryTitle (const Comment& summary)
{
    if (summary.valid && ! summary.lines.empty())
    {
        auto firstLine = choc::text::trim (summary.lines[0]);

        if (choc::text::startsWith (toLowerCase (firstLine), "title:"))
        {
            auto title = choc::text::trim (firstLine.substr (6));

            if (choc::text::endsWith (title, "."))
                title = title.substr (title.length() - 1);

            return title;
        }
    }

    return {};
}